

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O1

RC __thiscall PF_BufferMgr::ClearBuffer(PF_BufferMgr *this)

{
  int iVar1;
  PF_BufPageDesc *pPVar2;
  RC RVar3;
  int slot;
  
  if (this->first != -1) {
    slot = this->first;
    do {
      pPVar2 = this->bufTable;
      iVar1 = pPVar2[slot].next;
      if (pPVar2[slot].pinCount == 0) {
        RVar3 = PF_HashTable::Delete(&this->hashTable,pPVar2[slot].fd,pPVar2[slot].pageNum);
        if (RVar3 != 0) {
          return RVar3;
        }
        Unlink(this,slot);
        this->bufTable[slot].next = this->free;
        this->free = slot;
      }
      slot = iVar1;
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

RC PF_BufferMgr::ClearBuffer()
{
   RC rc;

   int slot, next;
   slot = first;
   while (slot != INVALID_SLOT) {
      next = bufTable[slot].next;
      if (bufTable[slot].pinCount == 0)
         if ((rc = hashTable.Delete(bufTable[slot].fd,
               bufTable[slot].pageNum)) ||
            (rc = Unlink(slot)) ||
            (rc = InsertFree(slot)))
         return (rc);
      slot = next;
   }

   return 0;
}